

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::SignCase::getInputValues(SignCase *this,int numValues,void **values)

{
  float fVar1;
  float fVar2;
  DataType dataType;
  pointer pSVar3;
  void *pvVar4;
  deUint32 dVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int in_R9D;
  ulong uVar10;
  uint uVar11;
  float fVar12;
  Random rnd;
  IVec2 intRanges [3];
  Vec2 floatRanges [3];
  deRandom local_78;
  int local_68 [8];
  float local_48 [6];
  
  local_48[0] = -2.0;
  local_48[1] = 2.0;
  local_48[2] = -10000.0;
  local_48[3] = 10000.0;
  local_48[4] = -1e+08;
  local_48[5] = 1e+08;
  local_68[0] = -0x80;
  local_68[1] = 0x7f;
  local_68[2] = -0x8000;
  local_68[3] = 0x7fff;
  local_68[4] = -0x80000000;
  local_68[5] = 0x7fffffff;
  dVar5 = deStringHash((this->super_CommonFunctionCase).super_TestCase.super_TestCase.super_TestNode
                       .m_name._M_dataplus._M_p);
  deRandom_init(&local_78,dVar5 ^ 0x324);
  pSVar3 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dataType = (pSVar3->varType).m_data.basic.type;
  uVar10 = (ulong)(pSVar3->varType).m_data.basic.precision;
  iVar6 = glu::getDataTypeScalarSize(dataType);
  lVar8 = (long)iVar6;
  lVar7 = lVar8 * 4;
  pvVar4 = *values;
  if (dataType - TYPE_FLOAT < 4) {
    if (iVar6 != 0) {
      lVar8 = 0;
      do {
        *(undefined4 *)((long)pvVar4 + lVar8) = 0x3f800000;
        lVar8 = lVar8 + 4;
      } while (lVar7 - lVar8 != 0);
    }
    lVar9 = (long)(iVar6 * 2);
    lVar8 = lVar7 + lVar9 * -4;
    while (lVar8 != 0) {
      *(undefined4 *)((long)pvVar4 + lVar7) = 0xbf800000;
      lVar7 = lVar7 + 4;
      lVar8 = lVar9 * 4 - lVar7;
    }
    lVar7 = (long)(iVar6 * 3);
    if (lVar9 * 4 + lVar7 * -4 != 0) {
      memset((void *)(lVar9 * 4 + (long)pvVar4),0,lVar7 * 4 + lVar9 * -4);
    }
    uVar11 = iVar6 * (numValues + -3);
    if (0 < (int)uVar11) {
      fVar1 = local_48[uVar10 * 2];
      fVar2 = local_48[uVar10 * 2 + 1];
      uVar10 = 0;
      do {
        fVar12 = deRandom_getFloat(&local_78);
        *(float *)((long)pvVar4 + uVar10 * 4 + lVar7 * 4) = fVar12 * (fVar2 - fVar1) + fVar1;
        uVar10 = uVar10 + 1;
      } while (uVar11 != uVar10);
    }
  }
  else {
    if (iVar6 != 0) {
      lVar9 = 0;
      do {
        *(undefined4 *)((long)pvVar4 + lVar9) = 1;
        lVar9 = lVar9 + 4;
      } while (lVar7 - lVar9 != 0);
    }
    lVar9 = (long)(iVar6 * 2);
    if (lVar7 + lVar9 * -4 != 0) {
      memset((void *)(lVar8 * 4 + (long)pvVar4),0xff,lVar9 * 4 + lVar8 * -4);
    }
    lVar7 = (long)(iVar6 * 3);
    if (lVar9 * 4 + lVar7 * -4 != 0) {
      memset((void *)(lVar9 * 4 + (long)pvVar4),0,lVar7 * 4 + lVar9 * -4);
    }
    fillRandomScalars<int>
              ((Random *)&local_78,local_68[uVar10 * 2],local_68[uVar10 * 2 + 1],
               (void *)(lVar7 * 4 + (long)pvVar4),iVar6 * (numValues + -3),in_R9D);
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 floatRanges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e4f,		1e4f),	// mediump	- note: may end up as inf
			Vec2(-1e8f,		1e8f)	// highp	- note: may end up as inf
		};
		const IVec2 intRanges[] =
		{
			IVec2(-(1<<7),		(1<<7)-1),
			IVec2(-(1<<15),		(1<<15)-1),
			IVec2(0x80000000,	0x7fffffff)
		};

		de::Random				rnd			(deStringHash(getName()) ^ 0x324u);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize	= glu::getDataTypeScalarSize(type);

		if (glu::isDataTypeFloatOrVec(type))
		{
			// Special cases.
			std::fill((float*)values[0],				(float*)values[0] + scalarSize,		+1.0f);
			std::fill((float*)values[0] + scalarSize*1,	(float*)values[0] + scalarSize*2,	-1.0f);
			std::fill((float*)values[0] + scalarSize*2,	(float*)values[0] + scalarSize*3,	0.0f);
			fillRandomScalars(rnd, floatRanges[precision].x(), floatRanges[precision].y(), (float*)values[0] + scalarSize*3, (numValues-3)*scalarSize);
		}
		else
		{
			std::fill((int*)values[0],					(int*)values[0] + scalarSize,		+1);
			std::fill((int*)values[0] + scalarSize*1,	(int*)values[0] + scalarSize*2,		-1);
			std::fill((int*)values[0] + scalarSize*2,	(int*)values[0] + scalarSize*3,		0);
			fillRandomScalars(rnd, intRanges[precision].x(), intRanges[precision].y(), (int*)values[0] + scalarSize*3, (numValues-3)*scalarSize);
		}
	}